

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Vector<int,_3>_>::genFixeds
          (DefaultSampling<tcu::Vector<int,_3>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *dst)

{
  ulong uVar1;
  pointer this_00;
  DefaultSampling<int> *pDVar2;
  size_type sVar3;
  reference pvVar4;
  Vector<int,_3> local_5c;
  ulong local_50;
  size_t scalarNdx;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> scalars;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *dst_local;
  FloatFormat *fmt_local;
  DefaultSampling<tcu::Vector<int,_3>_> *this_local;
  
  scalars.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)dst;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_38);
  pDVar2 = instance<vkt::shaderexecutor::DefaultSampling<int>>();
  (**(code **)*pDVar2)(pDVar2,fmt,(vector<int,_std::allocator<int>_> *)local_38);
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_38);
    this_00 = scalars.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
    if (sVar3 <= uVar1) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,local_50);
    tcu::Vector<int,_3>::Vector(&local_5c,*pvVar4);
    std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::push_back
              ((vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *)this_00,
               &local_5c);
    local_50 = local_50 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}